

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_0::FdConnectionReceiver::setsockopt
          (FdConnectionReceiver *this,int __fd,int __level,int __optname,void *__optval,
          socklen_t __optlen)

{
  int iVar1;
  undefined4 in_register_0000000c;
  int iVar2;
  Fault f;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  do {
    iVar1 = ::setsockopt((this->super_OwnedFileDescriptor).fd,__fd,__level,
                         (void *)CONCAT44(in_register_0000000c,__optname),(socklen_t)__optval);
    if (-1 < iVar1) {
      iVar2 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
    iVar2 = iVar1;
  } while (iVar1 == -1);
  if (iVar2 == 0) {
    return iVar1;
  }
  local_50.exception = (Exception *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  kj::_::Debug::Fault::init
            (&local_50,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_50);
}

Assistant:

void setsockopt(int level, int option, const void* value, uint length) override {
    KJ_SYSCALL(::setsockopt(fd, level, option, value, length));
  }